

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int write_path(archive_entry *entry,archive_write *archive)

{
  mode_t mVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  int local_40;
  size_t written_bytes;
  mode_t type;
  char *path;
  int ret;
  archive_write *archive_local;
  archive_entry *entry_local;
  
  __s = archive_entry_pathname(entry);
  mVar1 = archive_entry_filetype(entry);
  sVar3 = strlen(__s);
  iVar2 = __archive_write_output(archive,__s,sVar3);
  if (iVar2 == 0) {
    sVar3 = strlen(__s);
    local_40 = (int)sVar3;
    sVar3 = strlen(__s);
    if (mVar1 == 0x4000 && __s[sVar3 - 1] != '/') {
      iVar2 = __archive_write_output(archive,"/",1);
      if (iVar2 != 0) {
        return -0x1e;
      }
      local_40 = local_40 + 1;
    }
    entry_local._4_4_ = local_40;
  }
  else {
    entry_local._4_4_ = -0x1e;
  }
  return entry_local._4_4_;
}

Assistant:

static int
write_path(struct archive_entry *entry, struct archive_write *archive)
{
	int ret;
	const char *path;
	mode_t type;
	size_t written_bytes;

	path = archive_entry_pathname(entry);
	type = archive_entry_filetype(entry);
	written_bytes = 0;

	ret = __archive_write_output(archive, path, strlen(path));
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	written_bytes += strlen(path);

	/* Folders are recognized by a trailing slash. */
	if ((type == AE_IFDIR) & (path[strlen(path) - 1] != '/')) {
		ret = __archive_write_output(archive, "/", 1);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		written_bytes += 1;
	}

	return ((int)written_bytes);
}